

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld_opts.c
# Opt level: O3

int field_opts_off(FIELD *field,Field_Options opts)

{
  int iVar1;
  int *piVar2;
  
  if (field == (FIELD *)0x0) {
    field = _nc_Default_Field;
  }
  iVar1 = _nc_Synchronize_Options(field,(~opts | 0xfffffc00U) & field->opts);
  piVar2 = __errno_location();
  *piVar2 = iVar1;
  return iVar1;
}

Assistant:

int field_opts_off(FIELD  * field, Field_Options opts)
{
  int res = E_BAD_ARGUMENT;

  opts &= ALL_FIELD_OPTS;
  if (!(opts & ~ALL_FIELD_OPTS))
    {
      Normalize_Field( field );
      res = _nc_Synchronize_Options( field, field->opts & ~opts );
    }
  RETURN(res);
}